

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_info.cpp
# Opt level: O1

bool __thiscall
libtorrent::torrent_info::parse_torrent_file
          (torrent_info *this,bdecode_node *torrent_file,error_code *ec,load_torrent_limits *cfg)

{
  vector<announce_entry> *this_00;
  string *psVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  type_t tVar5;
  int iVar6;
  int iVar7;
  int64_t iVar8;
  char *pcVar9;
  bdecode_token *pbVar10;
  byte bVar11;
  int iVar12;
  int i;
  error_code *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *url;
  string_view key;
  string_view key_00;
  string_view key_01;
  string_view key_02;
  string_view key_03;
  string_view key_04;
  error_code eVar13;
  string_view sVar14;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  string_view key_05;
  string_view key_06;
  string_view key_07;
  string_view uri;
  string_view key_08;
  string_view key_09;
  string_view key_10;
  string_view key_11;
  string_view url_00;
  string_view url_01;
  bdecode_node url_seeds;
  bdecode_node nodes;
  bdecode_node similar;
  bdecode_node announce_node;
  bdecode_node url_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unique;
  bdecode_node collections;
  bdecode_node info;
  add_torrent_params p;
  int local_6b4;
  string local_6b0;
  bdecode_node local_690;
  vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_> *local_650;
  bdecode_node local_648;
  string local_608;
  bdecode_node local_5e8;
  string local_5a8;
  string local_588;
  bdecode_node local_568;
  bdecode_token local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  bdecode_node local_508;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4c8;
  bdecode_node local_498;
  headers_t local_458;
  bdecode_node local_440;
  bdecode_node local_400;
  undefined1 local_3c0 [48];
  undefined1 local_390 [40];
  uint8_t local_368;
  uint8_t local_367;
  byte local_366;
  uint local_29c [2];
  uint auStack_294 [4];
  uint auStack_284 [2];
  uint local_27c [2];
  uint auStack_274 [2];
  uint local_26c;
  bdecode_node local_70;
  
  tVar5 = bdecode_node::type(torrent_file);
  if (tVar5 != dict_t) {
    eVar13 = errors::make_error_code(torrent_is_no_dict);
    ec->val_ = eVar13.val_;
    ec->failed_ = eVar13.failed_;
    *(int3 *)&ec->field_0x5 = eVar13._5_3_;
    ec->cat_ = eVar13.cat_;
    return (bool)0;
  }
  sVar14._M_str = "info";
  sVar14._M_len = 4;
  bdecode_node::dict_find_dict(&local_400,torrent_file,sVar14);
  bVar4 = bdecode_node::operator_cast_to_bool(&local_400);
  if (!bVar4) {
    key_07._M_str = "magnet-uri";
    key_07._M_len = 10;
    bdecode_node::dict_find_string(&local_5e8,torrent_file,key_07);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_5e8);
    if (bVar4) {
      sVar14 = bdecode_node::string_value(&local_5e8);
      uri._M_len = sVar14._M_str;
      uri._M_str = (char *)ec;
      parse_magnet_uri((add_torrent_params *)local_3c0,(libtorrent *)sVar14._M_len,uri,in_R8);
      bVar4 = ec->failed_;
      if (bVar4 == false) {
        (this->m_info_hash).v2.m_number._M_elems[7] = local_26c;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 3) = local_27c;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 5) = auStack_274;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 4) = auStack_294._8_8_;
        *(uint (*) [2])((this->m_info_hash).v2.m_number._M_elems + 1) = auStack_284;
        *(uint (*) [2])(this->m_info_hash).v1.m_number._M_elems = local_29c;
        *(undefined8 *)((this->m_info_hash).v1.m_number._M_elems + 2) = auStack_294._0_8_;
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::reserve(&(this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                  ,((long)(local_3c0._32_8_ - local_3c0._24_8_) >> 5) +
                   ((long)(this->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_urls).
                          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          .
                          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) * -0x5555555555555555);
        for (; local_3c0._24_8_ != local_3c0._32_8_; local_3c0._24_8_ = local_3c0._24_8_ + 0x20) {
          ::std::
          vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
          ::emplace_back<std::__cxx11::string_const&>
                    ((vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>
                      *)&this->m_urls,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     local_3c0._24_8_);
        }
      }
      bVar11 = bVar4 ^ 1;
      add_torrent_params::~add_torrent_params((add_torrent_params *)local_3c0);
    }
    else {
      eVar13 = errors::make_error_code(torrent_missing_info);
      ec->val_ = eVar13.val_;
      ec->failed_ = eVar13.failed_;
      *(int3 *)&ec->field_0x5 = eVar13._5_3_;
      ec->cat_ = eVar13.cat_;
      bVar11 = 0;
    }
    if (local_5e8.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_003735b7;
  }
  bVar4 = parse_info_section(this,&local_400,ec,cfg->max_pieces);
  if ((bVar4) && (bVar4 = resolve_duplicate_filenames(this,cfg->max_duplicate_filenames,ec), bVar4))
  {
    bVar4 = digest32<256L>::is_all_zeros(&(this->m_info_hash).v2);
    if (!bVar4) {
      key_05._M_str = "piece layers";
      key_05._M_len = 0xc;
      bdecode_node::dict_find_dict((bdecode_node *)local_3c0,torrent_file,key_05);
      bVar4 = bdecode_node::operator_cast_to_bool((bdecode_node *)local_3c0);
      if ((bVar4) && (bVar4 = parse_piece_layers(this,(bdecode_node *)local_3c0,ec), !bVar4)) {
        (this->m_files).m_piece_length = 0;
        if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
        }
        goto LAB_003735b5;
      }
      if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
        operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
      }
    }
    key_06._M_str = "similar";
    key_06._M_len = 7;
    bdecode_node::dict_find_list(&local_5e8,torrent_file,key_06);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_5e8);
    if (bVar4) {
      for (iVar12 = 0; iVar6 = bdecode_node::list_size(&local_5e8), iVar12 < iVar6;
          iVar12 = iVar12 + 1) {
        bdecode_node::list_at((bdecode_node *)local_3c0,&local_5e8,iVar12);
        tVar5 = bdecode_node::type((bdecode_node *)local_3c0);
        if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
        }
        if (tVar5 == string_t) {
          bdecode_node::list_at((bdecode_node *)local_3c0,&local_5e8,iVar12);
          iVar6 = bdecode_node::string_length((bdecode_node *)local_3c0);
          if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
            operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
          }
          if (iVar6 == 0x14) {
            bdecode_node::list_at((bdecode_node *)local_3c0,&local_5e8,iVar12);
            local_498.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 (pointer)bdecode_node::string_ptr((bdecode_node *)local_3c0);
            ::std::vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>::
            emplace_back<char_const*>
                      ((vector<libtorrent::digest32<160l>,std::allocator<libtorrent::digest32<160l>>>
                        *)&this->m_owned_similar_torrents,(char **)&local_498);
            if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
              operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
            }
          }
        }
      }
    }
    key_08._M_str = "collections";
    key_08._M_len = 0xb;
    bdecode_node::dict_find_list(&local_498,torrent_file,key_08);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_498);
    if (bVar4) {
      for (iVar12 = 0; iVar6 = bdecode_node::list_size(&local_498), iVar12 < iVar6;
          iVar12 = iVar12 + 1) {
        bdecode_node::list_at((bdecode_node *)local_3c0,&local_498,iVar12);
        tVar5 = bdecode_node::type((bdecode_node *)local_3c0);
        if (tVar5 == string_t) {
          local_568.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)bdecode_node::string_ptr((bdecode_node *)local_3c0);
          iVar6 = bdecode_node::string_length((bdecode_node *)local_3c0);
          local_648.m_tokens.
          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)(long)iVar6;
          ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<char_const*,unsigned_long>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                     &this->m_owned_collections,(char **)&local_568,(unsigned_long *)&local_648);
        }
        if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
        }
      }
    }
    key_09._M_str = "announce-list";
    key_09._M_len = 0xd;
    bdecode_node::dict_find_list(&local_568,torrent_file,key_09);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_568);
    if (bVar4) {
      iVar12 = bdecode_node::list_size(&local_568);
      this_00 = &this->m_urls;
      ::std::
      vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>::
      reserve(&this_00->
               super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
              ,(long)iVar12);
      iVar12 = bdecode_node::list_size(&local_568);
      if (0 < iVar12) {
        iVar6 = 0;
        do {
          bdecode_node::list_at(&local_648,&local_568,iVar6);
          tVar5 = bdecode_node::type(&local_648);
          if ((tVar5 == list_t) && (iVar7 = bdecode_node::list_size(&local_648), 0 < iVar7)) {
            i = 0;
            do {
              sVar14 = bdecode_node::list_string_value_at(&local_648,i,(string_view)ZEXT816(0));
              v1_2::announce_entry::announce_entry((announce_entry *)local_3c0,sVar14);
              aux::ltrim((string *)local_3c0);
              if ((element_type *)local_3c0._8_8_ != (element_type *)0x0) {
                local_368 = (uint8_t)iVar6;
                local_367 = '\0';
                local_366 = (local_366 & 0xf0) + 1;
                bVar4 = aux::is_i2p_url((string *)local_3c0);
                if (bVar4) {
                  (this->m_flags).m_val = (this->m_flags).m_val | 4;
                }
                ::std::
                vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                ::push_back(&this_00->
                             super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                            ,(announce_entry *)local_3c0);
              }
              v1_2::announce_entry::~announce_entry((announce_entry *)local_3c0);
              i = i + 1;
            } while (iVar7 != i);
          }
          if (local_648.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_648.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_648.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_648.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != iVar12);
      }
      if ((this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (this->m_urls).
          super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          .
          super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        aux::
        random_shuffle<libtorrent::aux::container_wrapper<libtorrent::v1_2::announce_entry,int,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>>
                  (this_00);
        ::std::
        stable_sort<__gnu_cxx::__normal_iterator<libtorrent::v1_2::announce_entry*,std::vector<libtorrent::v1_2::announce_entry,std::allocator<libtorrent::v1_2::announce_entry>>>,libtorrent::torrent_info::parse_torrent_file(libtorrent::bdecode_node_const&,boost::system::error_code&,libtorrent::load_torrent_limits_const&)::__0>
                  ((this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (this->m_urls).
                   super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   .
                   super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    if ((this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->m_urls).
        super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        .
        super__Vector_base<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      key._M_str = "announce";
      key._M_len = 8;
      sVar14 = bdecode_node::dict_find_string_value(torrent_file,key,(string_view)ZEXT816(0));
      v1_2::announce_entry::announce_entry((announce_entry *)local_3c0,sVar14);
      local_367 = '\0';
      local_366 = (local_366 & 0xf0) + 1;
      aux::ltrim((string *)local_3c0);
      bVar4 = aux::is_i2p_url((string *)local_3c0);
      if (bVar4) {
        (this->m_flags).m_val = (this->m_flags).m_val | 4;
      }
      if ((element_type *)local_3c0._8_8_ != (element_type *)0x0) {
        ::std::
        vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
        ::push_back(&(this->m_urls).
                     super_vector<libtorrent::v1_2::announce_entry,_std::allocator<libtorrent::v1_2::announce_entry>_>
                    ,(value_type *)local_3c0);
      }
      v1_2::announce_entry::~announce_entry((announce_entry *)local_3c0);
    }
    key_10._M_str = "nodes";
    key_10._M_len = 5;
    bdecode_node::dict_find_list(&local_648,torrent_file,key_10);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_648);
    if ((bVar4) && (iVar12 = bdecode_node::list_size(&local_648), 0 < iVar12)) {
      iVar6 = 0;
      do {
        bdecode_node::list_at((bdecode_node *)local_3c0,&local_648,iVar6);
        tVar5 = bdecode_node::type((bdecode_node *)local_3c0);
        bVar4 = true;
        if ((tVar5 == list_t) &&
           (iVar7 = bdecode_node::list_size((bdecode_node *)local_3c0), 1 < iVar7)) {
          bdecode_node::list_at(&local_440,(bdecode_node *)local_3c0,0);
          tVar5 = bdecode_node::type(&local_440);
          if (tVar5 == string_t) {
            bdecode_node::list_at(&local_70,(bdecode_node *)local_3c0,1);
            tVar5 = bdecode_node::type(&local_70);
            bVar4 = tVar5 != int_t;
            bVar2 = true;
            bVar3 = true;
          }
          else {
            bVar3 = true;
            bVar2 = false;
            bVar4 = true;
          }
        }
        else {
          bVar2 = false;
          bVar3 = false;
        }
        if ((bVar2) &&
           (local_70.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_70.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_70.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_70.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if ((bVar3) &&
           (local_440.m_tokens.
            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0)) {
          operator_delete(local_440.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_440.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_440.m_tokens.
                                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (!bVar4) {
          bdecode_node::list_at(&local_690,(bdecode_node *)local_3c0,0);
          local_4c8._M_impl._0_16_ = bdecode_node::string_value(&local_690);
          bdecode_node::list_at(&local_508,(bdecode_node *)local_3c0,1);
          iVar8 = bdecode_node::int_value(&local_508);
          local_6b4 = (int)iVar8;
          ::std::
          vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
          ::emplace_back<std::basic_string_view<char,std::char_traits<char>>,int>
                    ((vector<std::pair<std::__cxx11::string,int>,std::allocator<std::pair<std::__cxx11::string,int>>>
                      *)&this->m_nodes,
                     (basic_string_view<char,_std::char_traits<char>_> *)&local_4c8,&local_6b4);
          if (local_508.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_508.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_508.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_508.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          if (local_690.m_tokens.
              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_690.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_690.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_690.m_tokens.
                                  super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
        }
        if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)0x0) {
          operator_delete((void *)local_3c0._0_8_,local_3c0._16_8_ - local_3c0._0_8_);
        }
        iVar6 = iVar6 + 1;
      } while (iVar12 != iVar6);
    }
    key_00._M_str = "creation date";
    key_00._M_len = 0xd;
    iVar8 = bdecode_node::dict_find_int_value(torrent_file,key_00,-1);
    if (-1 < iVar8) {
      this->m_creation_date = iVar8;
    }
    key_11._M_str = "url-list";
    key_11._M_len = 8;
    pcVar9 = "url-list";
    bdecode_node::dict_find(&local_690,torrent_file,key_11);
    bVar4 = bdecode_node::operator_cast_to_bool(&local_690);
    if (((bVar4) && (tVar5 = bdecode_node::type(&local_690), tVar5 == string_t)) &&
       (iVar12 = bdecode_node::string_length(&local_690), 0 < iVar12)) {
      sVar14 = bdecode_node::string_value(&local_690);
      url_00._M_len = sVar14._M_str;
      url_00._M_str = pcVar9;
      maybe_url_encode_abi_cxx11_(&local_588,(libtorrent *)sVar14._M_len,url_00);
      local_5a8._M_string_length = 0;
      local_5a8.field_2._M_local_buf[0] = '\0';
      local_458.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_458.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_458.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_5a8._M_dataplus._M_p = (pointer)&local_5a8.field_2;
      web_seed_entry::web_seed_entry((web_seed_entry *)local_3c0,&local_588,&local_5a8,&local_458);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~vector(&local_458);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a8._M_dataplus._M_p != &local_5a8.field_2) {
        operator_delete(local_5a8._M_dataplus._M_p,
                        CONCAT71(local_5a8.field_2._M_allocated_capacity._1_7_,
                                 local_5a8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_588._M_dataplus._M_p != &local_588.field_2) {
        operator_delete(local_588._M_dataplus._M_p,local_588.field_2._M_allocated_capacity + 1);
      }
      if (((((this->m_flags).m_val & 1) != 0) &&
          (iVar12 = file_storage::num_files(&this->m_files), 1 < iVar12)) &&
         (((element_type *)local_3c0._8_8_ == (element_type *)0x0 ||
          (((pointer)(local_3c0._0_8_ + -1))[local_3c0._8_8_] != '/')))) {
        ::std::__cxx11::string::push_back((char)local_3c0);
      }
      ::std::vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
      emplace_back<libtorrent::web_seed_entry>(&this->m_web_seeds,(web_seed_entry *)local_3c0);
      web_seed_entry::~web_seed_entry((web_seed_entry *)local_3c0);
    }
    else {
      bVar4 = bdecode_node::operator_cast_to_bool(&local_690);
      if ((bVar4) && (tVar5 = bdecode_node::type(&local_690), tVar5 == list_t)) {
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_4c8._M_impl.super__Rb_tree_header._M_header;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        pbVar10 = (bdecode_token *)0x0;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_4c8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_4c8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_4c8._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar12 = bdecode_node::list_size(&local_690);
        if (0 < iVar12) {
          local_650 = &this->m_web_seeds;
          iVar6 = 0;
          do {
            bdecode_node::list_at(&local_508,&local_690,iVar6);
            tVar5 = bdecode_node::type(&local_508);
            if ((tVar5 == string_t) && (iVar7 = bdecode_node::string_length(&local_508), iVar7 != 0)
               ) {
              sVar14 = bdecode_node::string_value(&local_508);
              url_01._M_len = sVar14._M_str;
              url_01._M_str = (char *)pbVar10;
              maybe_url_encode_abi_cxx11_(&local_608,(libtorrent *)sVar14._M_len,url_01);
              local_6b0._M_string_length = 0;
              local_6b0.field_2._M_local_buf[0] = '\0';
              local_528 = (bdecode_token)0x0;
              uStack_520 = 0;
              local_518 = 0;
              pbVar10 = &local_528;
              local_6b0._M_dataplus._M_p = (pointer)&local_6b0.field_2;
              web_seed_entry::web_seed_entry
                        ((web_seed_entry *)local_3c0,&local_608,&local_6b0,(headers_t *)&local_528);
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&local_528);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_6b0._M_dataplus._M_p != &local_6b0.field_2) {
                operator_delete(local_6b0._M_dataplus._M_p,
                                CONCAT71(local_6b0.field_2._M_allocated_capacity._1_7_,
                                         local_6b0.field_2._M_local_buf[0]) + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_608._M_dataplus._M_p != &local_608.field_2) {
                operator_delete(local_608._M_dataplus._M_p,
                                local_608.field_2._M_allocated_capacity + 1);
              }
              if (((((this->m_flags).m_val & 1) != 0) &&
                  (iVar7 = file_storage::num_files(&this->m_files), 1 < iVar7)) &&
                 (((element_type *)local_3c0._8_8_ == (element_type *)0x0 ||
                  (pbVar10 = (bdecode_token *)local_3c0._0_8_,
                  ((pointer)(local_3c0._0_8_ + -1))[local_3c0._8_8_] != '/')))) {
                ::std::__cxx11::string::push_back((char)local_3c0);
              }
              pVar15 = ::std::
                       _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       ::_M_insert_unique<std::__cxx11::string_const&>
                                 ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                                   *)&local_4c8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_3c0);
              if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                ::std::
                vector<libtorrent::web_seed_entry,_std::allocator<libtorrent::web_seed_entry>_>::
                emplace_back<libtorrent::web_seed_entry>(local_650,(web_seed_entry *)local_3c0);
              }
              ::std::
              vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_390 + 0x10));
              if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  local_3c0._32_8_ !=
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390) {
                operator_delete((void *)local_3c0._32_8_,local_390._0_8_ + 1);
              }
              if ((bdecode_token *)local_3c0._0_8_ != (bdecode_token *)(local_3c0 + 0x10)) {
                operator_delete((void *)local_3c0._0_8_,(ulong)(local_3c0._16_8_ + 1));
              }
            }
            if (local_508.m_tokens.
                super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_508.m_tokens.
                              super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_508.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_508.m_tokens.
                                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            iVar6 = iVar6 + 1;
          } while (iVar12 != iVar6);
        }
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree(&local_4c8);
      }
    }
    key_01._M_str = "comment.utf-8";
    key_01._M_len = 0xd;
    sVar14 = bdecode_node::dict_find_string_value(torrent_file,key_01,(string_view)ZEXT816(0));
    psVar1 = &this->m_comment;
    ::std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->m_comment)._M_string_length,(ulong)sVar14._M_str);
    if ((this->m_comment)._M_string_length == 0) {
      key_02._M_str = "comment";
      key_02._M_len = 7;
      sVar14 = bdecode_node::dict_find_string_value(torrent_file,key_02,(string_view)ZEXT816(0));
      ::std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->m_comment)._M_string_length,(ulong)sVar14._M_str);
    }
    aux::verify_encoding(psVar1);
    key_03._M_str = "created by.utf-8";
    key_03._M_len = 0x10;
    sVar14 = bdecode_node::dict_find_string_value(torrent_file,key_03,(string_view)ZEXT816(0));
    psVar1 = &this->m_created_by;
    ::std::__cxx11::string::_M_replace
              ((ulong)psVar1,0,(char *)(this->m_created_by)._M_string_length,(ulong)sVar14._M_str);
    if ((this->m_created_by)._M_string_length == 0) {
      key_04._M_str = "created by";
      key_04._M_len = 10;
      sVar14 = bdecode_node::dict_find_string_value(torrent_file,key_04,(string_view)ZEXT816(0));
      ::std::__cxx11::string::_M_replace
                ((ulong)psVar1,0,(char *)(this->m_created_by)._M_string_length,(ulong)sVar14._M_str)
      ;
    }
    aux::verify_encoding(psVar1);
    if (local_690.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_690.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_690.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_690.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_648.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_648.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_648.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_648.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_568.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_568.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_568.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_498.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_498.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_498.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_498.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_5e8.m_tokens.
        super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_5e8.m_tokens.
                      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_5e8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_5e8.m_tokens.
                            super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    bVar11 = 1;
  }
  else {
LAB_003735b5:
    bVar11 = 0;
  }
LAB_003735b7:
  if (local_400.m_tokens.
      super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_400.m_tokens.
                    super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_400.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_400.m_tokens.
                          super__Vector_base<libtorrent::aux::bdecode_token,_std::allocator<libtorrent::aux::bdecode_token>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)bVar11;
}

Assistant:

bool torrent_info::parse_torrent_file(bdecode_node const& torrent_file
		, error_code& ec, load_torrent_limits const& cfg)
	{
		if (torrent_file.type() != bdecode_node::dict_t)
		{
			ec = errors::torrent_is_no_dict;
			return false;
		}

		bdecode_node const info = torrent_file.dict_find_dict("info");
		if (!info)
		{
			bdecode_node const uri = torrent_file.dict_find_string("magnet-uri");
			if (uri)
			{
				auto const p = parse_magnet_uri(uri.string_value(), ec);
				if (ec) return false;

				m_info_hash = p.info_hashes;
				m_urls.reserve(m_urls.size() + p.trackers.size());
				for (auto const& url : p.trackers)
					m_urls.emplace_back(url);

				return true;
			}

			ec = errors::torrent_missing_info;
			return false;
		}

		if (!parse_info_section(info, ec, cfg.max_pieces)) return false;
		if (!resolve_duplicate_filenames(cfg.max_duplicate_filenames, ec)) return false;

		if (m_info_hash.has_v2())
		{
			// allow torrent files without piece layers, just like we allow magnet
			// links. However, if there are piece layers, make sure they're
			// valid
			bdecode_node const& e = torrent_file.dict_find_dict("piece layers");
			if (e && !parse_piece_layers(e, ec))
			{
				TORRENT_ASSERT(ec);
				// mark the torrent as invalid
				m_files.set_piece_length(0);
				return false;
			}
		}

#ifndef TORRENT_DISABLE_MUTABLE_TORRENTS
		bdecode_node const similar = torrent_file.dict_find_list("similar");
		if (similar)
		{
			for (int i = 0; i < similar.list_size(); ++i)
			{
				if (similar.list_at(i).type() != bdecode_node::string_t)
					continue;

				if (similar.list_at(i).string_length() != 20)
					continue;

				m_owned_similar_torrents.emplace_back(
					similar.list_at(i).string_ptr());
			}
		}

		bdecode_node const collections = torrent_file.dict_find_list("collections");
		if (collections)
		{
			for (int i = 0; i < collections.list_size(); ++i)
			{
				bdecode_node const str = collections.list_at(i);

				if (str.type() != bdecode_node::string_t) continue;

				m_owned_collections.emplace_back(str.string_ptr()
					, aux::numeric_cast<std::size_t>(str.string_length()));
			}
		}
#endif // TORRENT_DISABLE_MUTABLE_TORRENTS

		// extract the url of the tracker
		bdecode_node const announce_node = torrent_file.dict_find_list("announce-list");
		if (announce_node)
		{
			m_urls.reserve(announce_node.list_size());
			for (int j = 0, end(announce_node.list_size()); j < end; ++j)
			{
				bdecode_node const tier = announce_node.list_at(j);
				if (tier.type() != bdecode_node::list_t) continue;
				for (int k = 0, end2(tier.list_size()); k < end2; ++k)
				{
					announce_entry e(tier.list_string_value_at(k));
					aux::ltrim(e.url);
					if (e.url.empty()) continue;
					e.tier = std::uint8_t(j);
					e.fail_limit = 0;
					e.source = announce_entry::source_torrent;
#if TORRENT_USE_I2P
					if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
					m_urls.push_back(e);
				}
			}

			if (!m_urls.empty())
			{
				// shuffle each tier
				aux::random_shuffle(m_urls);
				std::stable_sort(m_urls.begin(), m_urls.end()
					, [](announce_entry const& lhs, announce_entry const& rhs)
					{ return lhs.tier < rhs.tier; });
			}
		}

		if (m_urls.empty())
		{
			announce_entry e(torrent_file.dict_find_string_value("announce"));
			e.fail_limit = 0;
			e.source = announce_entry::source_torrent;
			aux::ltrim(e.url);
#if TORRENT_USE_I2P
			if (aux::is_i2p_url(e.url)) m_flags |= i2p;
#endif
			if (!e.url.empty()) m_urls.push_back(e);
		}

		bdecode_node const nodes = torrent_file.dict_find_list("nodes");
		if (nodes)
		{
			for (int i = 0, end(nodes.list_size()); i < end; ++i)
			{
				bdecode_node const n = nodes.list_at(i);
				if (n.type() != bdecode_node::list_t
					|| n.list_size() < 2
					|| n.list_at(0).type() != bdecode_node::string_t
					|| n.list_at(1).type() != bdecode_node::int_t)
					continue;
				m_nodes.emplace_back(
					n.list_at(0).string_value()
					, int(n.list_at(1).int_value()));
			}
		}

		// extract creation date
		std::int64_t const cd = torrent_file.dict_find_int_value("creation date", -1);
		if (cd >= 0)
		{
			m_creation_date = std::time_t(cd);
		}

		// if there are any url-seeds, extract them
		bdecode_node const url_seeds = torrent_file.dict_find("url-list");
		if (url_seeds && url_seeds.type() == bdecode_node::string_t
			&& url_seeds.string_length() > 0)
		{
			web_seed_entry ent(maybe_url_encode(url_seeds.string_value()));
			if ((m_flags & multifile) && num_files() > 1)
				aux::ensure_trailing_slash(ent.url);
			m_web_seeds.push_back(std::move(ent));
		}
		else if (url_seeds && url_seeds.type() == bdecode_node::list_t)
		{
			// only add a URL once
			std::set<std::string> unique;
			for (int i = 0, end(url_seeds.list_size()); i < end; ++i)
			{
				bdecode_node const url = url_seeds.list_at(i);
				if (url.type() != bdecode_node::string_t) continue;
				if (url.string_length() == 0) continue;
				web_seed_entry ent(maybe_url_encode(url.string_value()));
				if ((m_flags & multifile) && num_files() > 1)
					aux::ensure_trailing_slash(ent.url);
				if (!unique.insert(ent.url).second) continue;
				m_web_seeds.push_back(std::move(ent));
			}
		}

		m_comment = torrent_file.dict_find_string_value("comment.utf-8");
		if (m_comment.empty()) m_comment = torrent_file.dict_find_string_value("comment");
		aux::verify_encoding(m_comment);

		m_created_by = torrent_file.dict_find_string_value("created by.utf-8");
		if (m_created_by.empty()) m_created_by = torrent_file.dict_find_string_value("created by");
		aux::verify_encoding(m_created_by);

		return true;
	}